

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *
helics::helicsGetComplexVector(string_view val)

{
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_RDI;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vectorVal;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_000002e0;
  string_view in_stack_000002e8;
  
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x323279);
  helicsGetComplexVector(in_stack_000002e8,in_stack_000002e0);
  return in_RDI;
}

Assistant:

std::vector<std::complex<double>> helicsGetComplexVector(std::string_view val)
{
    std::vector<std::complex<double>> vectorVal;
    helicsGetComplexVector(val, vectorVal);
    return vectorVal;
}